

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

void ucnv_getInvalidChars_63(UConverter *converter,char *errBytes,int8_t *len,UErrorCode *err)

{
  byte bVar1;
  
  if ((err != (UErrorCode *)0x0) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((converter == (UConverter *)0x0) || ((errBytes == (char *)0x0 || (len == (int8_t *)0x0)))) {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
    bVar1 = converter->invalidCharLength;
    if (*len < (char)bVar1) {
      *err = U_INDEX_OUTOFBOUNDS_ERROR;
      return;
    }
    *len = bVar1;
    if ('\0' < (char)bVar1) {
      memcpy(errBytes,converter->invalidCharBuffer,(ulong)bVar1);
      return;
    }
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_getInvalidChars (const UConverter * converter,
                      char *errBytes,
                      int8_t * len,
                      UErrorCode * err)
{
    if (err == NULL || U_FAILURE(*err))
    {
        return;
    }
    if (len == NULL || errBytes == NULL || converter == NULL)
    {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    if (*len < converter->invalidCharLength)
    {
        *err = U_INDEX_OUTOFBOUNDS_ERROR;
        return;
    }
    if ((*len = converter->invalidCharLength) > 0)
    {
        uprv_memcpy (errBytes, converter->invalidCharBuffer, *len);
    }
}